

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# group_impl.h
# Opt level: O2

int secp256k1_ge_x_frac_on_curve_var(secp256k1_fe *xn,secp256k1_fe *xd)

{
  int iVar1;
  secp256k1_fe local_78;
  secp256k1_fe local_48;
  
  secp256k1_fe_impl_mul(&local_48,xd,xn);
  secp256k1_fe_impl_sqr(&local_78,xn);
  secp256k1_fe_impl_mul(&local_48,&local_48,&local_78);
  secp256k1_fe_impl_sqr(&local_78,xd);
  secp256k1_fe_impl_sqr(&local_78,&local_78);
  local_48.n[0] = local_78.n[0] * 7 + local_48.n[0];
  local_48.n[1] = local_78.n[1] * 7 + local_48.n[1];
  local_48.n[2] = local_78.n[2] * 7 + local_48.n[2];
  local_48.n[3] = local_78.n[3] * 7 + local_48.n[3];
  local_48.n[4] = local_48.n[4] + local_78.n[4] * 7;
  iVar1 = secp256k1_fe_impl_is_square_var(&local_48);
  return iVar1;
}

Assistant:

static int secp256k1_ge_x_frac_on_curve_var(const secp256k1_fe *xn, const secp256k1_fe *xd) {
    /* We want to determine whether (xn/xd) is on the curve.
     *
     * (xn/xd)^3 + 7 is square <=> xd*xn^3 + 7*xd^4 is square (multiplying by xd^4, a square).
     */
     secp256k1_fe r, t;
     VERIFY_CHECK(!secp256k1_fe_normalizes_to_zero_var(xd));

     secp256k1_fe_mul(&r, xd, xn); /* r = xd*xn */
     secp256k1_fe_sqr(&t, xn); /* t = xn^2 */
     secp256k1_fe_mul(&r, &r, &t); /* r = xd*xn^3 */
     secp256k1_fe_sqr(&t, xd); /* t = xd^2 */
     secp256k1_fe_sqr(&t, &t); /* t = xd^4 */
     VERIFY_CHECK(SECP256K1_B <= 31);
     secp256k1_fe_mul_int(&t, SECP256K1_B); /* t = 7*xd^4 */
     secp256k1_fe_add(&r, &t); /* r = xd*xn^3 + 7*xd^4 */
     return secp256k1_fe_is_square_var(&r);
}